

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.hpp
# Opt level: O2

match_context * __thiscall
boost::xpressive::detail::
match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::push_context(match_context *__return_storage_ptr__,
              match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,regex_impl *impl,matchable *next,match_context *prev)

{
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar2;
  traits<char> *ptVar3;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *what;
  
  pmVar1 = (this->context_).prev_context_;
  pmVar2 = (this->context_).next_ptr_;
  ptVar3 = (this->context_).traits_;
  __return_storage_ptr__->results_ptr_ = (this->context_).results_ptr_;
  __return_storage_ptr__->prev_context_ = pmVar1;
  __return_storage_ptr__->next_ptr_ = pmVar2;
  __return_storage_ptr__->traits_ = ptVar3;
  what = results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::append_new(&this->extras_->results_cache_,
                      &__return_storage_ptr__->results_ptr_->nested_results_);
  init_(this,impl,what);
  (this->context_).prev_context_ = prev;
  (this->context_).next_ptr_ = next;
  (this->sub_matches_->begin_)._M_current = (this->cur_)._M_current;
  return __return_storage_ptr__;
}

Assistant:

match_context push_context(regex_impl const &impl, matchable const &next, match_context &prev)
    {
        // save state
        match_context context = this->context_;

        // create a new nested match_results for this regex
        nested_results<BidiIter> &nested = access::get_nested_results(*context.results_ptr_);
        match_results &what = this->extras_->results_cache_.append_new(nested);

        // (re)initialize the match context
        this->init_(impl, what);

        // create a linked list of match_context structs
        this->context_.prev_context_ = &prev;
        this->context_.next_ptr_ = &next;

        // record the start of the zero-th sub-match
        this->sub_matches_[0].begin_ = this->cur_;

        return context;
    }